

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_1> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long m;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x71c,
                  "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 2, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, Pack1 = 4, Pack2 = 2, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  lVar11 = 0;
  lVar9 = 0;
  uVar13 = 4;
  while (iVar12 = (int)uVar13, 0 < iVar12) {
    lVar5 = rows - lVar11;
    local_c8 = lVar11 * 8;
    lVar6 = uVar13 * 8;
    local_a8 = lVar11 * 8 + 0x18;
    local_b0 = lVar11 * 8 + 0x10;
    local_b8 = lVar11 * 8 + 8;
    for (; lVar11 < rows - lVar5 % (long)uVar13; lVar11 = lVar11 + uVar13) {
      if (iVar12 == 1) {
        lVar19 = 0;
      }
      else {
        lVar10 = 0;
        for (lVar19 = 0; lVar19 < (depth / 2) * 2; lVar19 = lVar19 + 2) {
          lVar17 = local_c8;
          for (uVar8 = 0; uVar8 < uVar13; uVar8 = uVar8 + 2) {
            lVar15 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
            puVar14 = (undefined8 *)
                      ((long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                      lVar15 * lVar17 + lVar10);
            for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 0x10) {
              uVar4 = puVar14[1];
              *(undefined8 *)((long)&local_58 + lVar18) = *puVar14;
              *(undefined8 *)((long)&uStack_50 + lVar18) = uVar4;
              puVar14 = puVar14 + lVar15;
            }
            pdVar16 = blockA + lVar9 + uVar8;
            *(undefined4 *)pdVar16 = (undefined4)local_58;
            *(undefined4 *)((long)pdVar16 + 4) = local_58._4_4_;
            *(undefined4 *)(pdVar16 + 1) = local_48;
            *(undefined4 *)((long)pdVar16 + 0xc) = uStack_44;
            pdVar16 = pdVar16 + uVar13;
            *(undefined4 *)pdVar16 = (undefined4)uStack_50;
            *(undefined4 *)((long)pdVar16 + 4) = uStack_50._4_4_;
            *(undefined4 *)(pdVar16 + 1) = uStack_40;
            *(undefined4 *)((long)pdVar16 + 0xc) = uStack_3c;
            lVar17 = lVar17 + 0x10;
          }
          lVar9 = lVar9 + (ulong)(uint)(iVar12 * 2);
          lVar10 = lVar10 + 0x10;
        }
      }
      lVar10 = lVar19 * 8;
      for (; lVar19 < depth; lVar19 = lVar19 + 1) {
        lVar17 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
        lVar18 = (long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data + lVar10;
        lVar15 = local_c8;
        for (uVar8 = 0; (long)uVar8 < (long)(iVar12 + -3); uVar8 = uVar8 + 4) {
          dVar1 = *(double *)(lVar18 + lVar17 * local_b8);
          dVar2 = *(double *)(lVar18 + local_b0 * lVar17);
          dVar3 = *(double *)(lVar18 + local_a8 * lVar17);
          blockA[lVar9 + uVar8] = *(double *)(lVar18 + local_c8 * lVar17);
          blockA[lVar9 + uVar8 + 1] = dVar1;
          blockA[lVar9 + uVar8 + 2] = dVar2;
          blockA[lVar9 + uVar8 + 3] = dVar3;
          lVar18 = lVar18 + lVar17 * 0x20;
          lVar15 = lVar15 + 0x20;
        }
        if ((uVar13 & 3) != 0) {
          lVar17 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
          pdVar16 = (double *)
                    ((long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                    lVar15 * lVar17 + lVar10);
          for (; uVar8 < uVar13; uVar8 = uVar8 + 1) {
            blockA[lVar9 + uVar8] = *pdVar16;
            pdVar16 = pdVar16 + lVar17;
          }
        }
        lVar9 = lVar9 + uVar8;
        lVar10 = lVar10 + 8;
      }
      local_c8 = local_c8 + lVar6;
      local_a8 = local_a8 + lVar6;
      local_b0 = local_b0 + lVar6;
      local_b8 = local_b8 + lVar6;
    }
    uVar7 = (uint)(iVar12 != 2) * 2;
    if (3 < iVar12) {
      uVar7 = iVar12 - 2;
    }
    uVar13 = (ulong)uVar7;
  }
  if (depth < 1) {
    depth = 0;
  }
  lVar6 = lVar11 * 8;
  for (; lVar11 < rows; lVar11 = lVar11 + 1) {
    lVar5 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    pdVar16 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
    for (lVar10 = 0; depth != lVar10; lVar10 = lVar10 + 1) {
      blockA[lVar9 + lVar10] = *(double *)((long)pdVar16 + lVar10 * 8 + lVar5 * lVar6);
    }
    lVar9 = lVar9 + lVar10;
    lVar6 = lVar6 + 8;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

//   const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
//   const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
//   const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;

  int pack = Pack1;
  Index i = 0;
  while(pack>0)
  {
    Index remaining_rows = rows-i;
    Index peeled_mc = i+(remaining_rows/pack)*pack;
    for(; i<peeled_mc; i+=pack)
    {
      if(PanelMode) count += pack * offset;

      const Index peeled_k = (depth/PacketSize)*PacketSize;
      Index k=0;
      if(pack>=PacketSize)
      {
        for(; k<peeled_k; k+=PacketSize)
        {
          for (Index m = 0; m < pack; m += PacketSize)
          {
            PacketBlock<Packet> kernel;
            for (int p = 0; p < PacketSize; ++p) kernel.packet[p] = lhs.loadPacket(i+p+m, k);
            ptranspose(kernel);
            for (int p = 0; p < PacketSize; ++p) pstore(blockA+count+m+(pack)*p, cj.pconj(kernel.packet[p]));
          }
          count += PacketSize*pack;
        }
      }
      for(; k<depth; k++)
      {
        Index w=0;
        for(; w<pack-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                 b(cj(lhs(i+w+1, k))),
                 c(cj(lhs(i+w+2, k))),
                 d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(pack%4)
          for(;w<pack;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }

      if(PanelMode) count += pack * (stride-offset-depth);
    }

    pack -= PacketSize;
    if(pack<Pack2 && (pack+PacketSize)!=Pack2)
      pack = Pack2;
  }

  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}